

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void pop_heap_suite::pop_decreasing_predicate(void)

{
  array<int,_4UL> heap;
  array<int,_4UL> expect;
  int local_38 [2];
  
  heap._M_elems[0] = 0xb;
  heap._M_elems[1] = 0x16;
  heap._M_elems[2] = 0x21;
  heap._M_elems[3] = 0x2c;
  vista::pop_heap<false,int*,std::greater<int>>(&heap,&expect);
  heap._M_elems[3] = 0;
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0x2c;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x297,"void pop_heap_suite::pop_decreasing_predicate()",heap._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  vista::pop_heap<false,int*,std::greater<int>>(&heap,heap._M_elems + 3);
  heap._M_elems[2] = 0;
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x2c;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x29e,"void pop_heap_suite::pop_decreasing_predicate()",heap._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  vista::pop_heap<false,int*,std::greater<int>>(&heap,heap._M_elems + 2);
  heap._M_elems[1] = 0;
  expect._M_elems[0] = 0x2c;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x2a5,"void pop_heap_suite::pop_decreasing_predicate()",heap._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  vista::pop_heap<false,int*,std::greater<int>>(&heap,heap._M_elems + 1);
  heap._M_elems[0] = 0;
  expect._M_elems[0] = 0;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x2ac,"void pop_heap_suite::pop_decreasing_predicate()",heap._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  return;
}

Assistant:

void pop_decreasing_predicate()
{
    std::array<int, 4> heap = { 11, 22, 33, 44 }; // Result of push_suite::push_decreasing_predicate
    auto last = heap.end();
    vista::pop_heap(heap.begin(), last, std::greater<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 22, 44, 33, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, std::greater<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 33, 44, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, std::greater<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 44, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
    vista::pop_heap(heap.begin(), last, std::greater<int>());
    *--last = 0;
    {
        std::array<int, 4> expect = { 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(heap.begin(), heap.end(),
                          expect.begin(), expect.end());
    }
}